

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::Mesh::owned_array<signed_char>(Mesh *this,Int ent_dim,Read<signed_char> *a,Int width)

{
  int *piVar1;
  undefined8 *puVar2;
  long *plVar3;
  Alloc *pAVar4;
  bool bVar5;
  undefined4 in_register_0000000c;
  ulong *puVar6;
  undefined8 extraout_RDX;
  void *pvVar7;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  undefined4 in_register_00000034;
  Mesh *this_00;
  int in_R8D;
  int iVar8;
  int ent_dim_00;
  Read<signed_char> RVar9;
  LOs o2e;
  Read<signed_char> o;
  LOs local_90;
  Read<signed_char> local_80;
  Read<signed_char> local_70;
  Alloc *local_60;
  void *local_58;
  Write<signed_char> local_50;
  Alloc *local_40;
  element_type *local_38;
  
  this_00 = (Mesh *)CONCAT44(in_register_00000034,ent_dim);
  puVar6 = (ulong *)CONCAT44(in_register_0000000c,width);
  puVar2 = (undefined8 *)*puVar6;
  if (((ulong)puVar2 & 1) == 0) {
    iVar8 = (int)*puVar2;
  }
  else {
    iVar8 = (int)((ulong)puVar2 >> 3);
  }
  ent_dim_00 = (int)a;
  check_dim2(this_00,ent_dim_00);
  if (this_00->nents_[ent_dim_00] * in_R8D == iVar8) {
    bVar5 = could_be_shared(this_00,ent_dim_00);
    if (bVar5) {
      owned((Mesh *)&local_40,ent_dim);
      local_70.write_.shared_alloc_.alloc = local_40;
      if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_70.write_.shared_alloc_.alloc = (Alloc *)(local_40->size * 8 + 1);
        }
        else {
          local_40->use_count = local_40->use_count + 1;
        }
      }
      local_70.write_.shared_alloc_.direct_ptr = local_38;
      collect_marked((Omega_h *)&local_60,&local_70);
      pAVar4 = local_70.write_.shared_alloc_.alloc;
      if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
          local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_70.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
          operator_delete(pAVar4,0x48);
        }
      }
      local_90.write_.shared_alloc_.alloc = local_60;
      if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_90.write_.shared_alloc_.alloc = (Alloc *)(local_60->size * 8 + 1);
        }
        else {
          local_60->use_count = local_60->use_count + 1;
        }
      }
      local_90.write_.shared_alloc_.direct_ptr = local_58;
      local_80.write_.shared_alloc_.alloc = (Alloc *)*puVar6;
      if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
          local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_80.write_.shared_alloc_.alloc =
               (Alloc *)((local_80.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_80.write_.shared_alloc_.alloc)->use_count =
               (local_80.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_80.write_.shared_alloc_.direct_ptr = (void *)puVar6[1];
      unmap<signed_char>((Omega_h *)&local_50,&local_90,&local_80,in_R8D);
      Read<signed_char>::Read((Read<signed_char> *)this,&local_50);
      pvVar7 = extraout_RDX_00;
      if (((ulong)local_50.shared_alloc_.alloc & 7) == 0 &&
          local_50.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_50.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_50.shared_alloc_.alloc);
          operator_delete(local_50.shared_alloc_.alloc,0x48);
          pvVar7 = extraout_RDX_01;
        }
      }
      pAVar4 = local_80.write_.shared_alloc_.alloc;
      if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
          local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_80.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
          operator_delete(pAVar4,0x48);
          pvVar7 = extraout_RDX_02;
        }
      }
      pAVar4 = local_90.write_.shared_alloc_.alloc;
      if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
          local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_90.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
          operator_delete(pAVar4,0x48);
          pvVar7 = extraout_RDX_03;
        }
      }
      if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
        piVar1 = &local_60->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_60);
          operator_delete(local_60,0x48);
          pvVar7 = extraout_RDX_04;
        }
      }
      if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
        piVar1 = &local_40->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_40);
          operator_delete(local_40,0x48);
          pvVar7 = extraout_RDX_05;
        }
      }
    }
    else {
      plVar3 = (long *)*puVar6;
      *(long **)this = plVar3;
      (this->comm_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)puVar6[1];
      bVar5 = ((ulong)plVar3 & 7) != 0;
      pvVar7 = (void *)CONCAT71((int7)((ulong)extraout_RDX >> 8),bVar5 || plVar3 == (long *)0x0);
      if ((!bVar5 && plVar3 != (long *)0x0) && (entering_parallel == '\x01')) {
        *(int *)(plVar3 + 6) = (int)plVar3[6] + -1;
        *(long *)this = *plVar3 * 8 + 1;
      }
      *puVar6 = 0;
      puVar6[1] = 0;
    }
    RVar9.write_.shared_alloc_.direct_ptr = pvVar7;
    RVar9.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar9.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == width * nents(ent_dim)",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.cpp"
       ,0x267);
}

Assistant:

Read<T> Mesh::owned_array(Int ent_dim, Read<T> a, Int width) {
  OMEGA_H_CHECK(a.size() == width * nents(ent_dim));
  if (!could_be_shared(ent_dim)) return a;
  auto o = owned(ent_dim);
  auto o2e = collect_marked(o);
  return unmap(o2e, a, width);
}